

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_buffer_block_legacy(CompilerGLSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t id;
  mapped_type *pmVar2;
  CompilerError *this_00;
  Bitset *this_01;
  bool local_6a;
  bool block_flag;
  Bitset *block_flags;
  allocator local_49;
  string local_48 [39];
  bool local_21;
  SPIRType *pSStack_20;
  bool ssbo;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  type = (SPIRType *)var;
  var_local = (SPIRVariable *)this;
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  pSStack_20 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
  local_6a = true;
  if (type->width != 0xc) {
    pmVar2 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&(this->super_Compiler).ir.meta,&(pSStack_20->super_IVariant).self);
    local_6a = Bitset::get(&(pmVar2->decoration).decoration_flags,3);
  }
  local_21 = local_6a;
  if (local_6a != false) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_48,"SSBOs not supported in legacy targets.",&local_49);
    CompilerError::CompilerError(this_00,(string *)local_48);
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  pmVar2 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_Compiler).ir.meta,&(pSStack_20->super_IVariant).self);
  this_01 = &(pmVar2->decoration).decoration_flags;
  bVar1 = Bitset::get(this_01,2);
  Bitset::clear(this_01,2);
  emit_struct(this,pSStack_20);
  if (bVar1) {
    Bitset::set(this_01,2);
  }
  (*(this->super_Compiler)._vptr_Compiler[0x20])(this,type);
  statement<char_const(&)[1]>(this,(char (*) [1])0x4d8596);
  return;
}

Assistant:

void CompilerGLSL::emit_buffer_block_legacy(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);
	bool ssbo = var.storage == StorageClassStorageBuffer ||
	            ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);
	if (ssbo)
		SPIRV_CROSS_THROW("SSBOs not supported in legacy targets.");

	// We're emitting the push constant block as a regular struct, so disable the block qualifier temporarily.
	// Otherwise, we will end up emitting layout() qualifiers on naked structs which is not allowed.
	auto &block_flags = ir.meta[type.self].decoration.decoration_flags;
	bool block_flag = block_flags.get(DecorationBlock);
	block_flags.clear(DecorationBlock);
	emit_struct(type);
	if (block_flag)
		block_flags.set(DecorationBlock);
	emit_uniform(var);
	statement("");
}